

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O0

void initSystem(int begX,int begY)

{
  short sVar1;
  char cVar2;
  char cVar3;
  int startY;
  WINDOW *pWVar4;
  reference pvVar5;
  arrowType *paVar6;
  undefined8 uVar7;
  ulong uVar8;
  size_type sVar9;
  double dVar10;
  __type _Var11;
  __type _Var12;
  int local_14c;
  int local_148;
  allocator local_141;
  string local_140 [36];
  int local_11c;
  string local_118 [4];
  int i_1;
  node local_e8;
  int local_40;
  int local_3c;
  int j;
  int i;
  WINDOW *menu;
  int local_28;
  int nID;
  int max_y;
  int max_x;
  int id;
  int y;
  int x;
  int c;
  int begY_local;
  int begX_local;
  
  menu._4_4_ = 0;
  if (_stdscr == 0) {
    local_148 = -1;
  }
  else {
    local_148 = *(short *)(_stdscr + 4) + 1;
  }
  local_28 = local_148;
  if (_stdscr == 0) {
    local_14c = -1;
  }
  else {
    local_14c = *(short *)(_stdscr + 6) + 1;
  }
  nID = local_14c;
  startX = begX;
  ::startY = begY;
  max_x = begY;
  x = begY;
  c = begX;
  for (local_3c = 0; local_3c < grid_size[0]; local_3c = local_3c + 1) {
    id = startX + 1;
    for (local_40 = 0; local_40 < grid_size[1]; local_40 = local_40 + 1) {
      node::node(&local_e8,menu._4_1_);
      std::vector<node,_std::allocator<node>_>::push_back(&grid,&local_e8);
      node::~node(&local_e8);
      pWVar4 = new_bwin(0xb,0x1a,max_x,id);
      pvVar5 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)menu._4_4_);
      pvVar5->w_main = pWVar4;
      pWVar4 = (WINDOW *)newwin(9,4,max_x + 1,id + 0x15);
      pvVar5 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)menu._4_4_);
      pvVar5->w_reg = pWVar4;
      pWVar4 = (WINDOW *)newwin(9,0x12,max_x + 1,id + 1);
      pvVar5 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)menu._4_4_);
      pvVar5->w_code = pWVar4;
      pWVar4 = new_bwin(0xb,0x14,max_x,id);
      pvVar5 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)menu._4_4_);
      pvVar5->w_divider = pWVar4;
      pvVar5 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)menu._4_4_);
      pWVar4 = pvVar5->w_reg;
      pvVar5 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)menu._4_4_);
      sVar1 = pvVar5->acc;
      pvVar5 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)menu._4_4_);
      wprintw(pWVar4," ACC%d\n BAK%d",(int)sVar1,(int)pvVar5->bak);
      pvVar5 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)menu._4_4_);
      wrefresh(pvVar5->w_reg);
      refresh();
      if (local_3c != 0) {
        pvVar5 = std::vector<node,_std::allocator<node>_>::operator[]
                           (&grid,(long)(menu._4_4_ - grid_size[1]));
        paVar6 = pvVar5->arrows[2];
        pvVar5 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)menu._4_4_);
        pvVar5->arrows[0] = paVar6;
      }
      if (local_40 != grid_size[1] + -1) {
        paVar6 = (arrowType *)operator_new(0x20);
        cVar2 = menu._4_1_;
        cVar3 = menu._4_1_ + '\x01';
        dVar10 = (double)max_x;
        _Var11 = std::floor<int>(5);
        _Var12 = std::floor<int>(2);
        arrow::arrow((arrow *)paVar6,cVar2,cVar3,(int)((dVar10 + _Var11) - _Var12),id + 0x1b,false);
        pvVar5 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)menu._4_4_);
        pvVar5->arrows[1] = paVar6;
        pvVar5 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)menu._4_4_);
        std::vector<arrowType_*,_std::allocator<arrowType_*>_>::push_back
                  (&gridArrows,pvVar5->arrows + 1);
      }
      if (local_3c != grid_size[0] + -1) {
        paVar6 = (arrowType *)operator_new(0x20);
        cVar3 = (char)menu._4_4_;
        cVar2 = (char)grid_size[0];
        startY = max_x + 0xb;
        dVar10 = (double)id;
        _Var11 = std::floor<int>(0xd);
        _Var12 = std::floor<int>(6);
        arrow::arrow((arrow *)paVar6,cVar3,cVar3 + cVar2,startY,(int)((dVar10 + _Var11) - _Var12),
                     true);
        pvVar5 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)menu._4_4_);
        pvVar5->arrows[2] = paVar6;
        pvVar5 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)menu._4_4_);
        std::vector<arrowType_*,_std::allocator<arrowType_*>_>::push_back
                  (&gridArrows,pvVar5->arrows + 2);
      }
      if (local_40 != 0) {
        pvVar5 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)(menu._4_4_ + -1))
        ;
        paVar6 = pvVar5->arrows[1];
        pvVar5 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)menu._4_4_);
        pvVar5->arrows[3] = paVar6;
      }
      menu._4_4_ = menu._4_4_ + 1;
      id = id + 0x20;
    }
    max_x = max_x + 0xc;
  }
  id = startX + 1;
  playButton = (WINDOW *)newwin(3,5,max_x,id);
  wbkgd(playButton,0x200);
  mvwprintw(playButton,1,0,"PLAY");
  wrefresh(playButton);
  id = id + 6;
  stopButton = (WINDOW *)newwin(3,5,max_x,id);
  wbkgd(stopButton,0x300);
  mvwprintw(stopButton,1,0,"STOP");
  wrefresh(stopButton);
  id = id + 6;
  pauseButton = (WINDOW *)newwin(3,5,max_x,id);
  wbkgd(pauseButton,0x400);
  mvwprintw(pauseButton,1,0,"PAUSE");
  wrefresh(pauseButton);
  id = id + 7;
  decreaseDelayButton = (WINDOW *)newwin(3,5,max_x,id);
  wbkgd(decreaseDelayButton);
  mvwprintw(decreaseDelayButton,1,2,anon_var_dwarf_3bfd7);
  wrefresh(decreaseDelayButton);
  id = id + 6;
  increaseDelayButton = (WINDOW *)newwin(3,5,max_x,id);
  wbkgd(increaseDelayButton,0x100);
  mvwprintw(increaseDelayButton,1,2,"+");
  wrefresh(increaseDelayButton);
  id = id + 6;
  pWVar4 = (WINDOW *)newwin(1,5,max_x + 1,id);
  delayValueWindow = pWVar4;
  intToString_abi_cxx11_((int)local_118);
  uVar7 = std::__cxx11::string::c_str();
  mvwprintw(pWVar4,0,0,"%s",uVar7);
  std::__cxx11::string::~string(local_118);
  wrefresh(delayValueWindow);
  local_11c = 0;
  while( true ) {
    uVar8 = (ulong)local_11c;
    sVar9 = std::vector<node,_std::allocator<node>_>::size(&grid);
    if (sVar9 <= uVar8) break;
    pvVar5 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)local_11c);
    sVar9 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&pvVar5->inputCode);
    if (sVar9 == 0) {
      pvVar5 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)local_11c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_140,"",&local_141);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pvVar5->inputCode,(value_type *)local_140);
      std::__cxx11::string::~string(local_140);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
    }
    local_11c = local_11c + 1;
  }
  refresh();
  return;
}

Assistant:

void initSystem(int begX, int begY) {
	startX = begX;
	startY = begY;
  int c, x, y, id;
  int max_x, max_y;
  int nID=0;
  WINDOW *menu;

  getmaxyx(stdscr, max_y, max_x);

  y = startY;
  for(int i=0;i<grid_size[0]; i++){
    x = startX + GAP_WIDTH_H;
    for(int j=0;j<grid_size[1];j++){
      grid.push_back(node(nID));
      grid[nID].w_main=new_bwin(NODE_HEIGHT, NODE_WIDTH, y, x);
      grid[nID].w_reg =newwin(NODE_HEIGHT-2,NODE_WIDTH-CODE_WIDTH-2, y+1, x+CODE_WIDTH+1);
      grid[nID].w_code=newwin(NODE_HEIGHT - 2, CODE_WIDTH - 2, y + 1 , x + 1);
      grid[nID].w_divider=new_bwin(NODE_HEIGHT, CODE_WIDTH, y, x);

      wprintw(grid[nID].w_reg, " ACC%d\n BAK%d", grid[nID].acc, grid[nID].bak);
      wrefresh(grid[nID].w_reg);
      refresh();

      if (i != 0) {
      	grid[nID].arrows[0] = grid[nID - grid_size[1]].arrows[2];
      }

      if (j != grid_size[1] - 1) {
      	grid[nID].arrows[1] = new arrow(nID, nID + 1, y + floor(NODE_HEIGHT / 2) - floor(ARROW_H_HEIGHT / 2), x + NODE_WIDTH + GAP_WIDTH_H, false);
      	gridArrows.push_back(grid[nID].arrows[1]);
      }

      if (i != grid_size[0] - 1) {
      	grid[nID].arrows[2] = new arrow(nID, nID + grid_size[0], y + NODE_HEIGHT + GAP_WIDTH_V, x + floor(NODE_WIDTH / 2) - floor(ARROW_V_WIDTH / 2), true);
	gridArrows.push_back(grid[nID].arrows[2]);
      }

      if (j != 0) {
      	grid[nID].arrows[3] = grid[nID - 1].arrows[1];
      }
      nID++;
      x = x + NODE_WIDTH + ARROW_H_WIDTH + 2 * GAP_WIDTH_H;
    }
    y=y+(NODE_HEIGHT+2*GAP_WIDTH_V+ARROW_V_HEIGHT);
  }

  x = startX + GAP_WIDTH_H;
  playButton = newwin(BUTTON_HEIGHT, BUTTON_WIDTH, y, x);
  wbkgd(playButton, COLOR_PAIR(2));
  mvwprintw(playButton, BUTTON_HEIGHT/2,0,"PLAY");
  wrefresh(playButton);
  x += BUTTON_WIDTH + GAP_WIDTH_H;

  stopButton = newwin(BUTTON_HEIGHT, BUTTON_WIDTH, y, x);
  wbkgd(stopButton, COLOR_PAIR(3));
  mvwprintw(stopButton, BUTTON_HEIGHT/2,0,"STOP");
  wrefresh(stopButton);

  x += BUTTON_WIDTH + GAP_WIDTH_H;
  pauseButton = newwin(BUTTON_HEIGHT, BUTTON_WIDTH, y, x);
  wbkgd(pauseButton, COLOR_PAIR(4));
  mvwprintw(pauseButton, BUTTON_HEIGHT/2,0,"PAUSE");
  wrefresh(pauseButton);


  x += BUTTON_WIDTH + GAP_WIDTH_H * 2;
	decreaseDelayButton = newwin(BUTTON_HEIGHT, BUTTON_WIDTH, y, x);
	wbkgd(decreaseDelayButton, COLOR_PAIR(1));
	mvwprintw(decreaseDelayButton, 1, 2, "–");
	wrefresh(decreaseDelayButton);
	
  x += BUTTON_WIDTH + GAP_WIDTH_H;
  increaseDelayButton = newwin(BUTTON_HEIGHT, BUTTON_WIDTH, y, x);
  wbkgd(increaseDelayButton, COLOR_PAIR(1));
	mvwprintw(increaseDelayButton, 1, 2, "+");
  wrefresh(increaseDelayButton);

  x += BUTTON_WIDTH + GAP_WIDTH_H;
  delayValueWindow = newwin(1, 5, y + 1, x);
  mvwprintw(delayValueWindow, 0, 0, "%s", intToString(tickDelay).c_str());
  wrefresh(delayValueWindow);
  
  for(int i=0; i < grid.size(); i++){
		if(grid[i].inputCode.size() == 0)
			grid[i].inputCode.push_back("");
  }

  refresh();

  return;
}